

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ST2052_TextParser.cpp
# Opt level: O0

IResourceResolver * __thiscall
AS_02::TimedText::ST2052_TextParser::h__TextParser::GetDefaultResolver(h__TextParser *this)

{
  bool bVar1;
  Type5UUIDFilenameResolver *this_00;
  IResourceResolver *pIVar2;
  string local_b0 [32];
  Type5UUIDFilenameResolver local_90;
  Type5UUIDFilenameResolver *local_18;
  Type5UUIDFilenameResolver *resolver;
  h__TextParser *this_local;
  
  resolver = (Type5UUIDFilenameResolver *)this;
  bVar1 = ASDCP::mem_ptr<ASDCP::TimedText::IResourceResolver>::empty(&this->m_DefaultResolver);
  if (bVar1) {
    this_00 = (Type5UUIDFilenameResolver *)operator_new(0x58);
    Type5UUIDFilenameResolver::Type5UUIDFilenameResolver(this_00);
    local_18 = this_00;
    Kumu::PathDirname(local_b0,(char)this + -0x50);
    Type5UUIDFilenameResolver::OpenRead(&local_90,(string *)this_00);
    Kumu::Result_t::~Result_t((Result_t *)&local_90);
    std::__cxx11::string::~string(local_b0);
    ASDCP::mem_ptr<ASDCP::TimedText::IResourceResolver>::operator=
              (&this->m_DefaultResolver,&local_18->super_IResourceResolver);
  }
  pIVar2 = ASDCP::mem_ptr::operator_cast_to_IResourceResolver_((mem_ptr *)&this->m_DefaultResolver);
  return pIVar2;
}

Assistant:

ASDCP::TimedText::IResourceResolver* GetDefaultResolver()
  {
    if ( m_DefaultResolver.empty() )
      {
	AS_02::TimedText::Type5UUIDFilenameResolver *resolver = new AS_02::TimedText::Type5UUIDFilenameResolver;
	resolver->OpenRead(PathDirname(m_Filename));
	m_DefaultResolver = resolver;
      }
    
    return m_DefaultResolver;
  }